

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O3

void __thiscall
BufferedReader::BufferedReader
          (BufferedReader *this,uint32_t blockSize,uint32_t allocSize,uint32_t prereadThreshold)

{
  condition_variable *this_00;
  _Rb_tree_header *p_Var1;
  uint uVar2;
  
  (this->super_AbstractReader).m_blockSize = 0;
  (this->super_AbstractReader).m_allocSize = 0;
  (this->super_AbstractReader).m_prereadThreshold = 0;
  (this->super_TerminatableThread).m_thread._M_id._M_thread = 0;
  (this->super_AbstractReader)._vptr_AbstractReader = (_func_int **)&PTR__BufferedReader_0023d1e8;
  (this->super_TerminatableThread)._vptr_TerminatableThread =
       (_func_int **)&PTR__BufferedReader_0023d278;
  this->m_started = false;
  this->m_terminated = false;
  (this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>._vptr_SafeQueue =
       (_func_int **)&PTR__SafeQueue_0023d358;
  (this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_mtx.
  super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_mtx.
           super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_mtx.
           super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_mtx.
  super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  *(__pthread_internal_list **)
   ((long)&(this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_mtx.
           super___mutex_base._M_mutex.__data.__list + 8) = (__pthread_internal_list *)0x0;
  (this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_queue.c.
  super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  *(size_t *)
   ((long)&(this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_queue.c.
           super__Deque_base<int,_std::allocator<int>_>._M_impl + 8) = 0;
  ((iterator *)
  ((long)&(this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_queue.c.
          super__Deque_base<int,_std::allocator<int>_>._M_impl + 0x10))->_M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_queue.c.
           super__Deque_base<int,_std::allocator<int>_>._M_impl + 0x18) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_queue.c.
           super__Deque_base<int,_std::allocator<int>_>._M_impl + 0x20) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_queue.c.
           super__Deque_base<int,_std::allocator<int>_>._M_impl + 0x28) = (_Map_pointer)0x0;
  ((iterator *)
  ((long)&(this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_queue.c.
          super__Deque_base<int,_std::allocator<int>_>._M_impl + 0x30))->_M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_queue.c.
           super__Deque_base<int,_std::allocator<int>_>._M_impl + 0x38) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_queue.c.
           super__Deque_base<int,_std::allocator<int>_>._M_impl + 0x40) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_queue.c.
           super__Deque_base<int,_std::allocator<int>_>._M_impl + 0x48) = (_Map_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)
             &(this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_queue,
             0);
  this_00 = &(this->m_readQueue).m_cond;
  (this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>.m_maxSize = 0x1000;
  (this->m_readQueue).super_SafeQueueWithNotification<int>.m_mtx = &(this->m_readQueue).m_mtx;
  (this->m_readQueue).super_SafeQueueWithNotification<int>.m_cond = this_00;
  (this->m_readQueue).super_SafeQueueWithNotification<int>.super_SafeQueue<int>._vptr_SafeQueue =
       (_func_int **)&PTR__WaitableSafeQueue_0023d2e8;
  (this->m_readQueue).m_mtx.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_readQueue).m_mtx.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_readQueue).m_mtx.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_readQueue).m_mtx.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_readQueue).m_mtx.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(this_00);
  std::condition_variable::condition_variable(&this->m_readCond);
  (this->m_readersMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->m_readersMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_readersMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_readersMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_readersMtx).super___mutex_base._M_mutex + 8) = 0;
  p_Var1 = &(this->m_readers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_readMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_readMtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_readMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_readMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->m_readMtx).super___mutex_base._M_mutex.__data.__list.__prev + 4) = 0
  ;
  *(undefined8 *)((long)&(this->m_readMtx).super___mutex_base._M_mutex.__data.__list.__next + 4) = 0
  ;
  (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_AbstractReader).m_blockSize = blockSize;
  if (allocSize == 0) {
    allocSize = blockSize;
  }
  (this->super_AbstractReader).m_allocSize = allocSize;
  uVar2 = blockSize >> 1;
  if (prereadThreshold != 0) {
    uVar2 = prereadThreshold;
  }
  (this->super_AbstractReader).m_prereadThreshold = uVar2;
  return;
}

Assistant:

BufferedReader::BufferedReader(const uint32_t blockSize, const uint32_t allocSize, const uint32_t prereadThreshold)
    : m_started(false), m_terminated(false), m_readQueue(QUEUE_MAX_SIZE), m_id(0)
{
    // size of the blocks being read
    m_blockSize = blockSize;
    // size of the memory reserved per-block (can exceed the block size, in which case the rest of the memory can be
    // used by the user)
    m_allocSize = allocSize ? allocSize : blockSize;
    // data preread threshold
    m_prereadThreshold = prereadThreshold ? prereadThreshold : m_blockSize / 2;
}